

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_dest_len_utf8(int eci,uchar *src,int src_len,uint replacement_char,uint flags,
                       int *p_dest_len)

{
  byte byte;
  int iVar1;
  uint in_ECX;
  int in_EDX;
  byte *in_RSI;
  int in_EDI;
  uint in_R8D;
  int *in_R9;
  bool bVar2;
  uint state;
  int ret;
  int dest_len;
  int replacement_len;
  uchar replacement [5];
  int src_incr;
  zueci_u32 u;
  zueci_utf8_func_t utf8_func;
  uchar *se;
  uchar *s;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  uchar local_4d [5];
  int local_48;
  uint local_44;
  zueci_utf8_func_t local_40;
  byte *local_38;
  byte *local_30;
  int *local_28;
  uint local_1c;
  uint local_18;
  byte *local_10;
  int local_8;
  int local_4;
  
  local_38 = in_RSI + in_EDX;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  local_30 = in_RSI;
  local_28 = in_R9;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = zueci_is_valid_eci(in_EDI);
  if (iVar1 == 0) {
    local_4 = 7;
  }
  else if ((local_10 == (byte *)0x0) || (local_28 == (int *)0x0)) {
    local_4 = 8;
  }
  else if ((local_8 == 899) ||
          (((local_1c & 1) != 0 &&
           ((((local_8 == 1 || (local_8 == 3)) || (local_8 == 0x1b)) || (local_8 == 0xaa)))))) {
    for (; local_30 < local_38; local_30 = local_30 + 1) {
      local_58 = (0x7f < *local_30) + 1 + local_58;
    }
    *local_28 = local_58;
    local_4 = 0;
  }
  else {
    if (local_18 != 0) {
      if (((0xd7ff < local_18) && ((local_18 < 0xe000 || (0x10ffff < local_18)))) ||
         (0xffff < local_18)) {
        return 8;
      }
      local_54 = zueci_encode_utf8(local_18,local_4d);
    }
    if ((local_8 == 1) || (local_8 == 3)) {
      for (; local_30 < local_38; local_30 = local_30 + 1) {
        if ((*local_30 < 0x80) || (0x9f < *local_30)) {
          iVar1 = (0x7f < *local_30) + 1;
        }
        else {
          if (local_18 == 0) {
            return 6;
          }
          local_5c = 1;
          iVar1 = local_54;
        }
        local_58 = iVar1 + local_58;
      }
      *local_28 = local_58;
      local_4 = local_5c;
    }
    else if (local_8 == 0x1a) {
      local_60 = 0;
      while (local_30 < local_38) {
        do {
          byte = *local_30;
          local_30 = local_30 + 1;
          zueci_decode_utf8(&local_60,&local_44,byte);
          bVar2 = false;
          if ((local_30 < local_38) && (bVar2 = false, local_60 != 0)) {
            bVar2 = local_60 != 0xc;
          }
        } while (bVar2);
        if (local_60 == 0) {
          iVar1 = (0x7f < local_44) + 1 + (uint)(0x7ff < local_44) + (uint)(0xffff < local_44);
        }
        else {
          if (local_18 == 0) {
            return 9;
          }
          if (local_30[-1] < 0x80) {
            local_30 = local_30 + -1;
          }
          else {
            while( true ) {
              bVar2 = false;
              if (local_30 < local_38) {
                bVar2 = (*local_30 & 0xc0) == 0x80;
              }
              if (!bVar2) break;
              local_30 = local_30 + 1;
            }
          }
          local_5c = 1;
          local_60 = 0;
          iVar1 = local_54;
        }
        local_58 = iVar1 + local_58;
      }
      *local_28 = local_58;
      local_4 = local_5c;
    }
    else {
      if (local_8 == 0xaa) {
        local_40 = zueci_ascii_inv_u;
      }
      else {
        local_40 = zueci_utf8_funcs[local_8];
      }
      while (local_30 < local_38) {
        local_48 = (*local_40)(local_30,(int)local_38 - (int)local_30,local_1c,&local_44);
        if (local_48 == 0) {
          if (local_18 == 0) {
            return 6;
          }
          iVar1 = zueci_replacement_incr(local_8,local_30,(int)local_38 - (int)local_30);
          local_30 = local_30 + iVar1;
          local_58 = local_54 + local_58;
          local_5c = 1;
        }
        else {
          local_30 = local_30 + local_48;
          local_58 = (0x7f < local_44) + 1 + (uint)(0x7ff < local_44) + (uint)(0xffff < local_44) +
                     local_58;
        }
      }
      *local_28 = local_58;
      local_4 = local_5c;
    }
  }
  return local_4;
}

Assistant:

ZUECI_EXTERN int zueci_dest_len_utf8(const int eci, const unsigned char src[], const int src_len,
                const unsigned int replacement_char, const int unsigned flags, int *p_dest_len) {
    const unsigned char *s = src;
    const unsigned char *const se = src + src_len;
    zueci_utf8_func_t utf8_func;
    zueci_u32 u;
    int src_incr;
    unsigned char replacement[5];
    int replacement_len = 0; /* g++ complains with "-Wmaybe-uninitialized" if this isn't set */
    int dest_len = 0;
    int ret = 0;

    /* NOTE: the following is "unrolled" from `zueci_eci_to_utf8()` and should be the same except for the copying */

    if (!zueci_is_valid_eci(eci)) {
        return ZUECI_ERROR_INVALID_ECI;
    }
    if (!src || !p_dest_len) {
        return ZUECI_ERROR_INVALID_ARGS;
    }

    /* Special case Binary, and if straight-thru flag set then ISO/IEC 8859-1, ASCII and ISO/IEC 646 Invariant also */
    if (eci == 899 || ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) && (eci == 1 || eci == 3 || eci == 27 || eci == 170))) {
        while (s < se) {
            dest_len += 1 + (*s++ >= 0x80);
        }
        *p_dest_len = dest_len;
        return 0;
    }

    if (replacement_char) {
        if (!ZUECI_IS_VALID_UNICODE(replacement_char) || replacement_char > 0xFFFF) { /* Allow BMP only */
            return ZUECI_ERROR_INVALID_ARGS;
        }
        replacement_len = zueci_encode_utf8(replacement_char, replacement);
    }

    /* Special case ISO/IEC 8859-1 */
    if (eci == 1 || eci == 3) {
        for (; s < se; s++) {
            if (*s >= 0x80 && *s < 0xA0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_DATA;
                }
                dest_len += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
            } else {
                dest_len += 1 + (*s >= 0x80);
            }
        }
        *p_dest_len = dest_len;
        return ret;
    }

    /* Special case UTF-8 */
    if (eci == 26) {
        unsigned int state = 0;
        while (s < se) {
            do {
                zueci_decode_utf8(&state, &u, *s++);
            } while (s < se && state != 0 && state != 12);
            if (state != 0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_UTF8;
                }
                if (*(s - 1) < 0x80) { /* If previous ASCII, backtrack */
                    s--;
                } else {
                    while (s < se && (*s & 0xC0) == 0x80) { /* Skip any continuation bytes */
                        s++;
                    }
                }
                dest_len += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
                state = 0;
            } else {
                dest_len += 1 + (u >= 0x80) + (u >= 0x800) + (u >= 0x10000);
            }
        }
        *p_dest_len = dest_len;
        return ret;
    }

    if (eci == 170) {
        utf8_func = zueci_ascii_inv_u;
    } else {
        utf8_func = zueci_utf8_funcs[eci];
    }

    while (s < se) {
        if (!(src_incr = (*utf8_func)(s, (int) (se - s), flags, &u))) {
            if (!replacement_char) {
                return ZUECI_ERROR_INVALID_DATA;
            }
            s += zueci_replacement_incr(eci, s, (int) (se - s));
            dest_len += replacement_len;
            ret = ZUECI_WARN_INVALID_DATA;
        } else {
            s += src_incr;
            dest_len += 1 + (u >= 0x80) + (u >= 0x800) + (u >= 0x10000);
        }
    }
    *p_dest_len = dest_len;
    return ret;
}